

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O0

time_type asio::detail::
          chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::add(time_type *t,duration_type *d)

{
  bool bVar1;
  strong_ordering sVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  time_type epoch;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffffa8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  __unspec in_stack_ffffffffffffffc7;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffc8;
  __unspec local_22;
  type local_21;
  duration<long,_std::ratio<1L,_1000000000L>_> *local_10;
  
  local_10 = in_RDI;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffffa0);
  local_21 = (type)std::chrono::
                   operator<=><std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                             ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_ffffffffffffffa8.__d.__r,in_stack_ffffffffffffffa0);
  std::__cmp_cat::__unspec::__unspec(&local_22,(__unspec *)0x0);
  bVar1 = std::operator>=(local_21);
  if (bVar1) {
    tVar3 = std::chrono::
            time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            ::max();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffa8.__d.__r,in_stack_ffffffffffffffa0);
    sVar2 = std::chrono::
            operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)tVar3.__d.__r,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
    std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xffffffffffffffc7,(__unspec *)0x0);
    bVar1 = std::operator<(sVar2._M_value);
    if (bVar1) {
      tVar3 = std::chrono::
              time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::max();
      return (duration)tVar3.__d.__r;
    }
  }
  else {
    in_stack_ffffffffffffffa8 =
         std::chrono::
         time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         ::min();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffa8.__d.__r,in_stack_ffffffffffffffa0);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-(local_10);
    sVar2 = std::chrono::
            operator<=><long,_std::ratio<1L,_1000000000L>,_long,_std::ratio<1L,_1000000000L>_>
                      (in_stack_ffffffffffffffc8,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                       CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)));
    std::__cmp_cat::__unspec::__unspec((__unspec *)&stack0xffffffffffffffa7,(__unspec *)0x0);
    bVar1 = std::operator>(sVar2._M_value);
    if (bVar1) {
      tVar3 = std::chrono::
              time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::min();
      return (duration)tVar3.__d.__r;
    }
  }
  tVar3 = std::chrono::operator+
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_ffffffffffffffa8.__d.__r,&in_stack_ffffffffffffffa0->__d);
  return (duration)tVar3.__d.__r;
}

Assistant:

static time_type add(const time_type& t, const duration_type& d)
  {
    const time_type epoch;
    if (t >= epoch)
    {
      if ((time_type::max)() - t < d)
        return (time_type::max)();
    }
    else // t < epoch
    {
      if (-(t - (time_type::min)()) > d)
        return (time_type::min)();
    }

    return t + d;
  }